

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O3

void __thiscall QStyleOptionGroupBox::QStyleOptionGroupBox(QStyleOptionGroupBox *this,int version)

{
  QStyleOption::QStyleOption((QStyleOption *)this,version,0xf0006);
  (this->super_QStyleOptionComplex).subControls =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)0xffffffff;
  (this->super_QStyleOptionComplex).activeSubControls =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)0x0;
  (this->features).super_QFlagsStorageHelper<QStyleOptionFrame::FrameFeature,_4>.
  super_QFlagsStorage<QStyleOptionFrame::FrameFeature>.i = 0;
  (this->text).d.d = (Data *)0x0;
  (this->text).d.ptr = (char16_t *)0x0;
  (this->text).d.size = 0;
  this->textAlignment = (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)0x1;
  (this->textColor).cspec = Invalid;
  (this->textColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->textColor).ct + 2) = 0;
  this->lineWidth = 0;
  this->midLineWidth = 0;
  return;
}

Assistant:

QStyleOptionGroupBox::QStyleOptionGroupBox(int version)
    : QStyleOptionComplex(version, Type), features(QStyleOptionFrame::None),
      textAlignment(Qt::AlignLeft), lineWidth(0), midLineWidth(0)
{
}